

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O3

void __thiscall Httpdata::handle_http(Httpdata *this,char *buff)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Httpdata *pHVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Http_Handle *this_01;
  const_iterator cVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  long *plVar12;
  DIR *__dirp;
  dirent *pdVar13;
  size_t sVar14;
  undefined8 *puVar15;
  ulong *puVar16;
  long *plVar17;
  size_type *psVar18;
  size_type sVar19;
  char cVar20;
  ulong uVar21;
  bool bVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string send_str;
  string body;
  string head;
  int index;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  key_type local_130;
  key_type local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  key_type local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  int local_8c;
  Httpdata *local_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  Http_Handle *local_60;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_8c = 0;
  this_01 = (Http_Handle *)operator_new(0xb8);
  Http_Handle::Http_Handle(this_01);
  handle_request_line(this,buff,&local_8c,this_01);
  local_88 = this;
  handle_request_head(this,buff,&local_8c,this_01);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Connection","");
  this_00 = &this_01->request_head;
  cVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_d0);
  local_58 = &this_00->_M_h;
  if (cVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar22 = false;
  }
  else {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Connection","");
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,&local_110);
    iVar6 = std::__cxx11::string::compare((char *)pmVar10);
    if (iVar6 == 0) {
      bVar22 = true;
    }
    else {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Connection","");
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,&local_130);
      iVar6 = std::__cxx11::string::compare((char *)pmVar10);
      bVar22 = iVar6 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (bVar22) {
    (local_88->super_channel).field_0x8c = 1;
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  psVar1 = &this_01->URI;
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar6 == 0) {
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    __dirp = opendir("/source");
    if (__dirp != (DIR *)0x0) {
      local_60 = this_01;
LAB_0010df23:
      pdVar13 = readdir(__dirp);
      if (pdVar13 != (dirent *)0x0) {
        if ((byte)pdVar13->d_name[0] == 0x2e) goto code_r0x0010df40;
        iVar6 = 0x2e - (uint)(byte)pdVar13->d_name[0];
        goto LAB_0010df5e;
      }
      closedir(__dirp);
      this_01 = local_60;
    }
    std::__cxx11::string::append((char *)&local_110);
    paVar2 = &local_130.field_2;
    pcVar3 = (this_01->_version)._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar3,pcVar3 + (this_01->_version)._M_string_length);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0);
    cVar20 = '\x01';
    if (9 < local_110._M_string_length) {
      sVar19 = local_110._M_string_length;
      cVar5 = '\x04';
      do {
        cVar20 = cVar5;
        if (sVar19 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_0010e5c2;
        }
        if (sVar19 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_0010e5c2;
        }
        if (sVar19 < 10000) goto LAB_0010e5c2;
        bVar22 = 99999 < sVar19;
        sVar19 = sVar19 / 10000;
        cVar5 = cVar20 + '\x04';
      } while (bVar22);
      cVar20 = cVar20 + '\x01';
    }
LAB_0010e5c2:
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct((ulong)&local_f0,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_f0,(uint)local_e8,local_110._M_string_length);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1119fd);
    plVar17 = plVar12 + 2;
    if ((long *)*plVar12 == plVar17) {
      local_140 = *plVar17;
      lStack_138 = plVar12[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar17;
      local_150 = (long *)*plVar12;
    }
    local_148 = plVar12[1];
    *plVar12 = (long)plVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
    psVar18 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_130.field_2._M_allocated_capacity = *psVar18;
      local_130.field_2._8_8_ = puVar15[3];
      local_130._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar18;
      local_130._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_130._M_string_length = puVar15[1];
    *puVar15 = psVar18;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    std::__cxx11::string::append((char *)&local_d0);
    goto LAB_0010ed6b;
  }
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar6 == 0) {
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    paVar2 = &local_130.field_2;
    pcVar3 = (this_01->_version)._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar3,pcVar3 + (this_01->_version)._M_string_length);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0);
    cVar20 = '\x01';
    if (9 < local_110._M_string_length) {
      sVar19 = local_110._M_string_length;
      cVar5 = '\x04';
      do {
        cVar20 = cVar5;
        if (sVar19 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_0010eaaa;
        }
        if (sVar19 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_0010eaaa;
        }
        if (sVar19 < 10000) goto LAB_0010eaaa;
        bVar22 = 99999 < sVar19;
        sVar19 = sVar19 / 10000;
        cVar5 = cVar20 + '\x04';
      } while (bVar22);
      cVar20 = cVar20 + '\x01';
    }
LAB_0010eaaa:
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct((ulong)&local_f0,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_f0,(uint)local_e8,local_110._M_string_length);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1119fd);
    plVar12 = puVar15 + 2;
    if ((long *)*puVar15 == plVar12) {
      local_140 = *plVar12;
      lStack_138 = puVar15[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar12;
      local_150 = (long *)*puVar15;
    }
    local_148 = puVar15[1];
    *puVar15 = plVar12;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
    psVar18 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_130.field_2._M_allocated_capacity = *psVar18;
      local_130.field_2._8_8_ = puVar15[3];
      local_130._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar18;
      local_130._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_130._M_string_length = puVar15[1];
    *puVar15 = psVar18;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    std::__cxx11::string::append((char *)&local_d0);
    goto LAB_0010ed6b;
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  pcVar3 = (this_01->URI)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar3,pcVar3 + (this_01->URI)._M_string_length);
  iVar6 = open(local_130._M_dataplus._M_p,0);
  if (iVar6 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"openfail",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
LAB_0010e48f:
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    pcVar3 = (this_01->_version)._M_dataplus._M_p;
    local_150 = &local_140;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar3,pcVar3 + (this_01->_version)._M_string_length);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_150);
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0);
    cVar20 = '\x01';
    if (9 < local_110._M_string_length) {
      sVar19 = local_110._M_string_length;
      cVar5 = '\x04';
      do {
        cVar20 = cVar5;
        if (sVar19 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_0010e70b;
        }
        if (sVar19 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_0010e70b;
        }
        if (sVar19 < 10000) goto LAB_0010e70b;
        bVar22 = 99999 < sVar19;
        sVar19 = sVar19 / 10000;
        cVar5 = cVar20 + '\x04';
      } while (bVar22);
      cVar20 = cVar20 + '\x01';
    }
LAB_0010e70b:
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_b0,(uint)local_a8,local_110._M_string_length);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1119fd);
    puVar16 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar16) {
      local_e0 = *puVar16;
      lStack_d8 = puVar15[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar16;
      local_f0 = (ulong *)*puVar15;
    }
    local_e8 = puVar15[1];
    *puVar15 = puVar16;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    plVar12 = puVar15 + 2;
    if ((long *)*puVar15 == plVar12) {
      local_140 = *plVar12;
      lStack_138 = puVar15[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar12;
      local_150 = (long *)*puVar15;
    }
    local_148 = puVar15[1];
    *puVar15 = plVar12;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_150);
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    std::__cxx11::string::append((char *)&local_d0);
  }
  else {
    if ((iVar6 == 0) ||
       (pcVar11 = (char *)mmap((void *)0x0,0x1000,1,1,iVar6,0),
       pcVar11 == (char *)0xffffffffffffffff)) goto LAB_0010e48f;
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar1);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x111ab1);
    puVar16 = (ulong *)(plVar12 + 2);
    if ((ulong *)*plVar12 == puVar16) {
      local_e0 = *puVar16;
      lStack_d8 = plVar12[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar16;
      local_f0 = (ulong *)*plVar12;
    }
    local_e8 = plVar12[1];
    *plVar12 = (long)puVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    plVar12 = puVar15 + 2;
    if ((long *)*puVar15 == plVar12) {
      local_140 = *plVar12;
      lStack_138 = puVar15[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar12;
      local_150 = (long *)*puVar15;
    }
    local_148 = puVar15[1];
    *puVar15 = plVar12;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_150);
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::string((string *)&local_150,pcVar11,(allocator *)&local_f0);
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_150);
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    std::__cxx11::string::append((char *)&local_110);
    pcVar3 = (this_01->_version)._M_dataplus._M_p;
    local_150 = &local_140;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar3,pcVar3 + (this_01->_version)._M_string_length);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_150);
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0);
    cVar20 = '\x01';
    if (9 < local_110._M_string_length) {
      sVar19 = local_110._M_string_length;
      cVar5 = '\x04';
      do {
        cVar20 = cVar5;
        if (sVar19 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_0010ebf3;
        }
        if (sVar19 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_0010ebf3;
        }
        if (sVar19 < 10000) goto LAB_0010ebf3;
        bVar22 = 99999 < sVar19;
        sVar19 = sVar19 / 10000;
        cVar5 = cVar20 + '\x04';
      } while (bVar22);
      cVar20 = cVar20 + '\x01';
    }
LAB_0010ebf3:
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_b0,(uint)local_a8,local_110._M_string_length);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1119fd);
    puVar16 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar16) {
      local_e0 = *puVar16;
      lStack_d8 = puVar15[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar16;
      local_f0 = (ulong *)*puVar15;
    }
    local_e8 = puVar15[1];
    *puVar15 = puVar16;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    plVar12 = puVar15 + 2;
    if ((long *)*puVar15 == plVar12) {
      local_140 = *plVar12;
      lStack_138 = puVar15[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar12;
      local_150 = (long *)*puVar15;
    }
    local_148 = puVar15[1];
    *puVar15 = plVar12;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_150);
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    std::__cxx11::string::append((char *)&local_d0);
    iVar8 = munmap(pcVar11,0x1000);
    if (iVar8 != 0) {
      __assert_fail("munmap((void*)ptr,4096) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/Httpdata.cpp"
                    ,0x88,"void Httpdata::handle_http(char *)");
    }
    close(iVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
LAB_0010ed6b:
  pcVar3 = (this_01->request_body)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this_01->request_body).field_2) {
    operator_delete(pcVar3);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_58);
  pcVar3 = (this_01->URI)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this_01->URI).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this_01->_version)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this_01->_version).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this_01->Req)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this_01->Req).field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(this_01);
  std::operator+(&local_130,&local_d0,&local_110);
  pHVar4 = local_88;
  strcpy((local_88->super_channel).write_buff,local_130._M_dataplus._M_p);
  (pHVar4->super_channel).write_length = (int)local_130._M_string_length;
  (*(pHVar4->super_channel)._vptr_channel[5])(pHVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
code_r0x0010df40:
  if (pdVar13->d_name[1] == '\0') goto LAB_0010df23;
  uVar7 = (byte)pdVar13->d_name[1] - 0x2e;
  if (uVar7 == 0) {
    uVar7 = (uint)(byte)pdVar13->d_name[2];
  }
  iVar6 = -uVar7;
LAB_0010df5e:
  if (iVar6 == 0) goto LAB_0010df23;
  pcVar11 = pdVar13->d_name;
  local_50[0] = local_40;
  sVar14 = strlen(pcVar11);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar11,pcVar11 + sVar14);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1119aa);
  local_b0 = &local_a0;
  plVar17 = plVar12 + 2;
  if ((long *)*plVar12 == plVar17) {
    local_a0 = *plVar17;
    lStack_98 = plVar12[3];
  }
  else {
    local_a0 = *plVar17;
    local_b0 = (long *)*plVar12;
  }
  local_a8 = plVar12[1];
  *plVar12 = (long)plVar17;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar16 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar16) {
    local_e0 = *puVar16;
    lStack_d8 = plVar12[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar16;
    local_f0 = (ulong *)*plVar12;
  }
  local_e8 = plVar12[1];
  *plVar12 = (long)puVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  local_80 = local_70;
  sVar14 = strlen(pcVar11);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,pcVar11,pcVar11 + sVar14);
  uVar21 = 0xf;
  if (local_f0 != &local_e0) {
    uVar21 = local_e0;
  }
  if (uVar21 < (ulong)(local_78 + local_e8)) {
    uVar21 = 0xf;
    if (local_80 != local_70) {
      uVar21 = local_70[0];
    }
    if ((ulong)(local_78 + local_e8) <= uVar21) {
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0010e0e3;
    }
  }
  puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_80);
LAB_0010e0e3:
  local_150 = &local_140;
  plVar12 = puVar15 + 2;
  if ((long *)*puVar15 == plVar12) {
    local_140 = *plVar12;
    lStack_138 = puVar15[3];
  }
  else {
    local_140 = *plVar12;
    local_150 = (long *)*puVar15;
  }
  local_148 = puVar15[1];
  *puVar15 = plVar12;
  puVar15[1] = 0;
  *(undefined1 *)plVar12 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_130.field_2._M_allocated_capacity = *psVar18;
    local_130.field_2._8_8_ = plVar12[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar18;
    local_130._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_130._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_130._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  goto LAB_0010df23;
}

Assistant:

void Httpdata::handle_http(char *buff)
{
    int index = 0;
    Http_Handle *Recv_Http = new Http_Handle();
    handle_request_line(buff,index,Recv_Http);
    handle_request_head(buff,index,Recv_Http);
    if(Recv_Http->request_head.count("Connection") != 0 &&  
        (Recv_Http->request_head["Connection"] == "keep-alive" || 
        Recv_Http->request_head["Connection"] == "Keep-Alive") )
    {
        Keep_Alive = true;
    }
    string head = "";
    string body = "";
    //if(Recv_Http->URI == "222")
    if(Recv_Http->URI == "/")
    {
        body += "<html><title>Source Page</title>";
        body += "<body bgcolor=\"ffffff\">";
        body += "!Thank for visiting MRWu_haha's Server!";
        body += "<meta http-equiv=\"Content-Type\" content=\"text/html; charset=utf-8\" />";
        body += "<br><a href=\"http://www.baidu.com\">百度一下</a>";
        body += "<br><a href=\"https://join.qq.com\">腾讯招聘</a>";
        body += "<br><a href=\"https://campus.kuaishou.cn\">快手招聘</a>";
        body += "<br><a href=\"https://uniportal.huawei.com\">华为招聘</a>";
        body += "<br><a href=\"https://campus.163.com\">网易招聘</a>";
        body += "<br><a href=\"https://careers.pinduoduo.com\">拼多多招聘</a>";
        body += "<br><a href=\"https://campus.alibaba.com\">阿里巴巴招聘</a>";
        body += "<br><a href=\"https://campus.bigo.sg\">BIGO招聘</a><br>";
        body += "<font size=\"5\"> MR-Wuhaha's Source Flie List: </font><br/>";
        DIR* source = opendir("/source");
        if(source != nullptr)
        {
            dirent* p_entry = nullptr;
            while((p_entry = readdir(source)) != nullptr)
            {
                if(!(p_entry->d_type & S_IFDIR) && (strcmp(".", p_entry->d_name) != 0 && strcmp("..", p_entry->d_name) != 0))
                {
                    body += "<br><a href=\"/source/" + string(p_entry->d_name) + "\">" + string(p_entry->d_name) + "</a>";
                }
            }
            closedir(source);
        }

        body += "</body></html>";
        head += Recv_Http->_version + " 200 OK\r\n";
        head += "Connection: Keep-Alive\r\n";
        head += "Content-type: text/html\r\n";
        head += "Content-Length: " + to_string(body.size()) + "\r\n";
        head += "\r\n";
    }
    else if(Recv_Http->URI == "/hello")
    {
        body += "<html><title>Hello</title>";
        body += "<body bgcolor=\"ffffff\">";
        body += "Thank for visiting this server!!!!";
        body += "<hr><em> MR_Wuhaha's WebServer </em>\n</body></html>";
        head += Recv_Http->_version + " 200 OK\r\n";
        head += "Connection: Keep-Alive\r\n";
        head += "Content-Type: text/html\r\n";
        head += "Content-Length: " + to_string(body.size()) + "\r\n";
        head += "\r\n";
    }
    else
    {
        string request_file_name = Recv_Http->URI;
        int request_fd = open(request_file_name.c_str(),O_RDONLY);
        if(request_fd < 0)
        {
            cout<<"openfail"<<endl;
        }
        char* ptr = nullptr;
        if(request_fd > 0 && (ptr = (char*)mmap(NULL,4096,PROT_READ,MAP_SHARED,request_fd,0)) != MAP_FAILED)
        {
            body += "<html>";
            body += "<title>" + Recv_Http->URI.substr(1) +  "</title>";
            body += "<head>";
            body += "<meta http-equiv=\"content-type\" content=\"text/html; charset=utf-8\">";
            body += "</head>";
            body += "<body bgcolor=\"ffffff\">";
            body += "MR_Wuhaha's WebServer";
            body += "<hr><pre style=\"word-wrap: break-word; white-space: pre-wrap; white-space: -moz-pre-wrap\">";
            body += string(ptr);
            body += "</pre>\n</body></html>";
            head += Recv_Http->_version + " 200 OK\r\n";
            head += "Connection: Keep-Alive\r\n";
            head += "Content-Type: text/html\r\n";
            head += "Content-Length: " + to_string(body.size()) + "\r\n";
            head += "\r\n";
            assert(munmap((void*)ptr,4096) == 0);
            close(request_fd);
        }
        else
        {
            body += "<html><title>Source Not Found</title>";
            body += "<body bgcolor=\"ffffff\">";
            body += "404 NOT_FOUND";
            body += "<hr><em> MR_Wuhaha's WebServer </em>\n</body></html>";
            head += Recv_Http->_version + " 404 NOTFOUND\r\n";
            head += "Connection: Keep-Alive\r\n";
            head += "Content-Type: text/html\r\n";
            head += "Content-Length: " + to_string(body.size()) + "\r\n";
            head += "\r\n";
        }
    }
    delete Recv_Http;
    string send_str = head + body;
    sprintf(write_buff, "%s", send_str.c_str());
    write_length = send_str.length();
    HandleWrite();
}